

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O2

void __thiscall
rlottie::Animation::setValue(Animation *this,Property param_2,string *param_3,ValueFunc *param_4)

{
  _Head_base<0UL,_AnimationImpl_*,_false> this_00;
  LOTVariant local_40;
  
  this_00._M_head_impl =
       (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t
       .super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
       super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl;
  LOTVariant::LOTVariant(&local_40,param_2,param_4);
  AnimationImpl::setValue(this_00._M_head_impl,param_3,&local_40);
  LOTVariant::Destroy(&local_40);
  return;
}

Assistant:

void Animation::setValue(Float_Type, Property prop, const std::string &keypath,
                         std::function<float(const FrameInfo &)> &&value)
{
    d->setValue(keypath, LOTVariant(prop, value));
}